

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O3

double __thiscall HighsLpRelaxation::LpRow::getMaxAbsVal(LpRow *this,HighsMipSolver *mipsolver)

{
  long lVar1;
  
  if (this->origin == kCutPool) {
    lVar1 = 0x1a0;
  }
  else {
    if (this->origin != kModel) {
      return 0.0;
    }
    lVar1 = 0x6478;
  }
  return *(double *)
          (*(long *)((long)&((mipsolver->mipdata_)._M_t.
                             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                             .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                            mipsolver + lVar1) + (long)this->index * 8);
}

Assistant:

double HighsLpRelaxation::LpRow::getMaxAbsVal(
    const HighsMipSolver& mipsolver) const {
  switch (origin) {
    case kCutPool:
      return mipsolver.mipdata_->cutpool.getMaxAbsCutCoef(index);
    case kModel:
      return mipsolver.mipdata_->maxAbsRowCoef[index];
  };

  assert(false);
  return 0.0;
}